

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.h
# Opt level: O0

int prune_ref(MV_REFERENCE_FRAME *ref_frame,uint *ref_display_order_hint,
             uint frame_display_order_hint,int *ref_frame_list)

{
  int iVar1;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  int i;
  int local_2c;
  
  local_2c = 0;
  while( true ) {
    if (1 < local_2c) {
      return 0;
    }
    if ((*(int *)(in_RCX + (long)local_2c * 4) != -1) &&
       ((((int)*in_RDI == *(int *)(in_RCX + (long)local_2c * 4) ||
         ((int)in_RDI[1] == *(int *)(in_RCX + (long)local_2c * 4))) &&
        (iVar1 = av1_encoder_get_relative_dist
                           (*(int *)(in_RSI + (long)(*(int *)(in_RCX + (long)local_2c * 4) + -1) * 4
                                    ),in_EDX), iVar1 < 0)))) break;
    local_2c = local_2c + 1;
  }
  return 1;
}

Assistant:

static inline int prune_ref(const MV_REFERENCE_FRAME *const ref_frame,
                            const unsigned int *const ref_display_order_hint,
                            const unsigned int frame_display_order_hint,
                            const int *ref_frame_list) {
  for (int i = 0; i < 2; i++) {
    if (ref_frame_list[i] == NONE_FRAME) continue;

    if (ref_frame[0] == ref_frame_list[i] ||
        ref_frame[1] == ref_frame_list[i]) {
      if (av1_encoder_get_relative_dist(
              ref_display_order_hint[ref_frame_list[i] - LAST_FRAME],
              frame_display_order_hint) < 0)
        return 1;
    }
  }
  return 0;
}